

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O1

expected<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* tinyusdz::usda::EnumHandler<tinyusdz::APISchemas::APIName>
            (expected<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *prop_name,string *tok,
            vector<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
            *enums)

{
  ulong *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppVar3;
  size_type sVar4;
  string *psVar5;
  int iVar6;
  pointer ppVar7;
  ostream *poVar8;
  long *plVar9;
  undefined8 *puVar10;
  pointer pbVar11;
  pointer *ppbVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer pbVar14;
  size_type *psVar15;
  ulong uVar16;
  long lVar17;
  pointer pbVar18;
  ulong uVar19;
  string s;
  expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toks;
  ostringstream oss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e8;
  long local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  string local_2c8;
  undefined1 local_2a8 [24];
  long lStack_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  string *local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  long local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  char local_240;
  string *local_238;
  pointer *local_230;
  long local_228;
  pointer local_220;
  long lStack_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  expected<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  undefined2 *local_1c8;
  undefined8 local_1c0;
  undefined2 local_1b8;
  undefined6 uStack_1b6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  local_268 = tok;
  if (((enums->
       super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
       )._M_impl.super__Vector_impl_data._M_start ==
       (enums->
       super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
       )._M_impl.super__Vector_impl_data._M_finish) ||
     (iVar6 = ::std::__cxx11::string::compare((char *)tok), iVar6 == 0)) {
    local_240 = '\x01';
    local_260 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_260._1_7_,1);
    goto LAB_00142169;
  }
  uVar16 = 0;
  do {
    uVar16 = uVar16 + 1;
    uVar19 = (long)(enums->
                   super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(enums->
                   super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4;
    if (uVar19 <= uVar16) goto LAB_00141bb2;
    iVar6 = ::std::__cxx11::string::compare((char *)local_268);
  } while (iVar6 != 0);
  local_240 = '\x01';
  local_260 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_260._1_7_,1);
  if (uVar16 < uVar19) goto LAB_00142169;
LAB_00141bb2:
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar7 = (enums->
           super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_238 = prop_name;
  local_1f0 = __return_storage_ptr__;
  if ((enums->
      super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar7) {
    lVar17 = 8;
    uVar16 = 0;
    do {
      ::std::__cxx11::string::string
                ((string *)local_1a8,*(char **)((long)&ppVar7->first + lVar17),
                 (allocator *)local_288._M_local_buf);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
                 local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      uVar16 = uVar16 + 1;
      ppVar7 = (enums->
               super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar17 = lVar17 + 0x10;
    } while (uVar16 < (ulong)((long)(enums->
                                    super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar7 >> 4)
            );
  }
  local_2e8 = &local_2d8;
  local_2e0 = 2;
  local_2d8._M_allocated_capacity._0_3_ = 0x202c;
  local_2c8.field_2._M_allocated_capacity._0_2_ = 0x22;
  local_2c8._M_string_length = 1;
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  quote((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_2a8,&local_1e8,&local_2c8);
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (local_2a8._0_8_ != local_2a8._8_8_) {
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,((_Alloc_hider *)local_2a8._0_8_)->_M_p,
               *(size_type *)(local_2a8._0_8_ + 8));
    local_2a8._0_8_ = local_2a8._0_8_ + 0x20;
    if (local_2a8._0_8_ != local_2a8._8_8_) {
      do {
        poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_2e8->_M_local_buf,local_2e0);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,(((pointer)local_2a8._0_8_)->_M_dataplus)._M_p,
                   ((pointer)local_2a8._0_8_)->_M_string_length);
        local_2a8._0_8_ = local_2a8._0_8_ + 0x20;
      } while (local_2a8._0_8_ != local_2a8._8_8_);
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  ::std::ios_base::~ios_base(local_138);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  psVar5 = local_268;
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8._M_allocated_capacity + 1);
  }
  ::std::operator+(&local_210,"Allowed tokens are [",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_288);
  plVar9 = (long *)::std::__cxx11::string::append((char *)&local_210);
  pbVar14 = (pointer)(local_2a8 + 0x10);
  pbVar11 = (pointer)(plVar9 + 2);
  if ((pointer)*plVar9 == pbVar11) {
    local_2a8._16_8_ = (pbVar11->_M_dataplus)._M_p;
    lStack_290 = plVar9[3];
    local_2a8._0_8_ = pbVar14;
  }
  else {
    local_2a8._16_8_ = (pbVar11->_M_dataplus)._M_p;
    local_2a8._0_8_ = (pointer)*plVar9;
  }
  local_2a8._8_8_ = plVar9[1];
  *plVar9 = (long)pbVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  local_1c8 = &local_1b8;
  local_1b8 = 0x22;
  local_1c0 = 1;
  paVar2 = &local_1a8[0].field_2;
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>((string *)local_1a8,local_1c8,(long)&local_1b8 + 1);
  ::std::__cxx11::string::_M_append((char *)local_1a8,(ulong)(psVar5->_M_dataplus)._M_p);
  plVar9 = (long *)::std::__cxx11::string::_M_append((char *)local_1a8,(ulong)local_1c8);
  prop_name = local_238;
  ppbVar12 = (pointer *)(plVar9 + 2);
  if ((pointer *)*plVar9 == ppbVar12) {
    local_220 = *ppbVar12;
    lStack_218 = plVar9[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *ppbVar12;
    local_230 = (pointer *)*plVar9;
  }
  local_228 = plVar9[1];
  *plVar9 = (long)ppbVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  pbVar11 = (pointer)((long)&((_Alloc_hider *)local_2a8._8_8_)->_M_p + local_228);
  pbVar18 = (pointer)0xf;
  if ((pointer)local_2a8._0_8_ != pbVar14) {
    pbVar18 = (pointer)local_2a8._16_8_;
  }
  if (pbVar18 < pbVar11) {
    pbVar18 = (pointer)0xf;
    if (local_230 != &local_220) {
      pbVar18 = local_220;
    }
    if (pbVar18 < pbVar11) goto LAB_00141f38;
    puVar10 = (undefined8 *)
              ::std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,local_2a8._0_8_);
  }
  else {
LAB_00141f38:
    puVar10 = (undefined8 *)::std::__cxx11::string::_M_append(local_2a8,(ulong)local_230);
  }
  psVar15 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_2c8.field_2._M_allocated_capacity = *psVar15;
    local_2c8.field_2._8_8_ = puVar10[3];
    local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  }
  else {
    local_2c8.field_2._M_allocated_capacity = *psVar15;
    local_2c8._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_2c8._M_string_length = puVar10[1];
  *puVar10 = psVar15;
  puVar10[1] = 0;
  *(undefined1 *)psVar15 = 0;
  plVar9 = (long *)::std::__cxx11::string::append((char *)&local_2c8);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 == paVar13) {
    local_2d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2d8._8_8_ = plVar9[3];
    local_2e8 = &local_2d8;
  }
  else {
    local_2d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9;
  }
  local_250._M_allocated_capacity = local_2d8._M_allocated_capacity;
  local_258 = plVar9[1];
  *plVar9 = (long)paVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if (local_2e8 == &local_2d8) {
    local_1a8[0].field_2._8_8_ = local_2d8._8_8_;
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1a8[0]._M_dataplus._M_p = (pointer)local_2e8;
  }
  local_2e0 = 0;
  local_2d8._M_allocated_capacity = local_2d8._M_allocated_capacity & 0xffffffffffffff00;
  local_260 = &local_250;
  local_240 = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p == paVar2) {
    local_250._8_8_ = local_1a8[0].field_2._8_8_;
  }
  else {
    local_260 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8[0]._M_dataplus._M_p;
  }
  local_1a8[0]._M_string_length = 0;
  local_1a8[0].field_2._M_allocated_capacity = local_250._M_allocated_capacity & 0xffffffffffffff00;
  local_2e8 = &local_2d8;
  local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  __return_storage_ptr__ = local_1f0;
  if (local_230 != &local_220) {
    operator_delete(local_230,(ulong)((long)&(local_220->_M_dataplus)._M_p + 1));
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT62(uStack_1b6,local_1b8) + 1);
  }
  if ((pointer)local_2a8._0_8_ != pbVar14) {
    operator_delete((void *)local_2a8._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_2a8._16_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_allocated_capacity != &local_278) {
    operator_delete((void *)local_288._M_allocated_capacity,local_278._M_allocated_capacity + 1);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
LAB_00142169:
  psVar5 = local_268;
  if (local_240 == '\0') {
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_260,local_258 + (long)local_260);
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    puVar1 = (ulong *)((long)&(__return_storage_ptr__->contained).
                              super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0 + 0x10);
    *(ulong **)
     &(__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0 = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p == &local_1a8[0].field_2) {
      *puVar1 = local_1a8[0].field_2._M_allocated_capacity;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x18) = local_1a8[0].field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_dataplus._M_p = local_1a8[0]._M_dataplus._M_p;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x10) = local_1a8[0].field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_string_length = local_1a8[0]._M_string_length;
  }
  else {
    ppVar3 = (enums->
             super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar7 = (enums->
                  super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_const_char_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar3; ppVar7 = ppVar7 + 1)
    {
      iVar6 = ::std::__cxx11::string::compare((char *)psVar5);
      if (iVar6 == 0) {
        (__return_storage_ptr__->contained).
        super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = true;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value = ppVar7->first;
        goto LAB_0014252c;
      }
    }
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"\"","");
    paVar2 = &local_1a8[0].field_2;
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_210._M_dataplus._M_p,
               local_210._M_dataplus._M_p + local_210._M_string_length);
    ::std::__cxx11::string::_M_append((char *)local_1a8,(ulong)(psVar5->_M_dataplus)._M_p);
    plVar9 = (long *)::std::__cxx11::string::_M_append
                               ((char *)local_1a8,(ulong)local_210._M_dataplus._M_p);
    local_2a8._0_8_ = local_2a8 + 0x10;
    pbVar14 = (pointer)(plVar9 + 2);
    if ((pointer)*plVar9 == pbVar14) {
      local_2a8._16_8_ = (pbVar14->_M_dataplus)._M_p;
      lStack_290 = plVar9[3];
    }
    else {
      local_2a8._16_8_ = (pbVar14->_M_dataplus)._M_p;
      local_2a8._0_8_ = (pointer)*plVar9;
    }
    local_2a8._8_8_ = plVar9[1];
    *plVar9 = (long)pbVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    puVar10 = (undefined8 *)::std::__cxx11::string::append(local_2a8);
    psVar15 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_2c8.field_2._M_allocated_capacity = *psVar15;
      local_2c8.field_2._8_8_ = puVar10[3];
      local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
    }
    else {
      local_2c8.field_2._M_allocated_capacity = *psVar15;
      local_2c8._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_2c8._M_string_length = puVar10[1];
    *puVar10 = psVar15;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    plVar9 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_2c8,(ulong)(prop_name->_M_dataplus)._M_p);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar13) {
      local_2d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2d8._8_8_ = plVar9[3];
      local_2e8 = &local_2d8;
    }
    else {
      local_2d8._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9;
    }
    local_2e0 = plVar9[1];
    *plVar9 = (long)paVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)::std::__cxx11::string::append((char *)&local_2e8);
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar13) {
      local_278._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_278._8_8_ = plVar9[3];
      local_288._M_allocated_capacity = (size_type)&local_278;
    }
    else {
      local_278._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_288._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_1a8[0].field_2._0_8_ = local_278._M_allocated_capacity;
    sVar4 = plVar9[1];
    *plVar9 = (long)paVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_allocated_capacity == &local_278) {
      local_1a8[0].field_2._8_8_ = local_278._8_8_;
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_1a8[0]._M_dataplus._M_p = (pointer)local_288._M_allocated_capacity;
    }
    local_278._M_allocated_capacity = local_278._M_allocated_capacity & 0xffffffffffffff00;
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_has_value = false;
    puVar1 = (ulong *)((long)&(__return_storage_ptr__->contained).
                              super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .field_0 + 0x10);
    *(ulong **)
     &(__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0 = puVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p == paVar2) {
      *puVar1 = local_1a8[0].field_2._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x18) = local_1a8[0].field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_error._M_dataplus._M_p = local_1a8[0]._M_dataplus._M_p;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->contained).
               super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .field_0 + 0x10) = local_1a8[0].field_2._0_8_;
    }
    (__return_storage_ptr__->contained).
    super_storage_t_impl<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .field_0.m_error._M_string_length = sVar4;
    local_1a8[0].field_2._M_allocated_capacity = local_1a8[0].field_2._0_8_ & 0xffffffffffffff00;
    local_1a8[0]._M_string_length = 0;
    local_288._8_8_ = 0;
    local_288._M_allocated_capacity = (size_type)&local_278;
    local_1a8[0]._M_dataplus._M_p = (pointer)paVar2;
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,local_2d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
      operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_2a8._0_8_ != (pointer)(local_2a8 + 0x10)) {
      operator_delete((void *)local_2a8._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_2a8._16_8_)->_M_p + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0014252c:
  if ((local_240 == '\0') && (local_260 != &local_250)) {
    operator_delete(local_260,local_250._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<T, std::string> EnumHandler(
    const std::string &prop_name, const std::string &tok,
    const std::vector<std::pair<T, const char *>> &enums) {
  auto ret = CheckAllowedTokens<T>(enums, tok);
  if (!ret) {
    return nonstd::make_unexpected(ret.error());
  }

  for (auto &item : enums) {
    if (tok == item.second) {
      return item.first;
    }
  }
  // Should never reach here, though.
  return nonstd::make_unexpected(
      quote(tok) + " is an invalid token for attribute `" + prop_name + "`");
}